

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcProve.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkMiterFraig(Abc_Ntk_t *pNtk,int nBTLimit,ABC_INT64_T nInspLimit,int *pRetValue,int *pNumFails,
                 ABC_INT64_T *pNumConfs,ABC_INT64_T *pNumInspects)

{
  int iVar1;
  int iVar2;
  Fraig_Man_t *p;
  int *__src;
  void *pvVar3;
  int *pModel;
  int RetValue;
  int nWordsMin;
  int nWords2;
  int nWords1;
  Fraig_Man_t *pMan;
  Fraig_Params_t *pParams;
  Fraig_Params_t Params;
  Abc_Ntk_t *pNtkNew;
  ABC_INT64_T *pNumConfs_local;
  int *pNumFails_local;
  int *pRetValue_local;
  ABC_INT64_T nInspLimit_local;
  int nBTLimit_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkNodeNum(pNtk);
  iVar2 = Abc_NtkCiNum(pNtk);
  iVar1 = Abc_MinInt(0x20,(int)(0x8000000 / (long)(iVar1 + iVar2)));
  Fraig_ParamsSetDefault((Fraig_Params_t *)&pParams);
  pParams._0_4_ = iVar1 << 5;
  pParams._4_4_ = iVar1 << 5;
  Params.nPatsDyna = -1;
  Params.fDoSparse = 0;
  Params.fFeedBack = 1;
  Params.fChoicing = 0;
  Params.nPatsRand = nBTLimit;
  Params._48_8_ = nInspLimit;
  p = (Fraig_Man_t *)Abc_NtkToFraig(pNtk,(Fraig_Params_t *)&pParams,0,0);
  Fraig_ManProveMiter(p);
  iVar1 = Fraig_ManCheckMiter(p);
  Params.nInspLimit = (ABC_INT64_T)Abc_NtkFromFraig(p,pNtk);
  if (iVar1 == 0) {
    __src = Fraig_ManReadModel(p);
    if (*(long *)(Params.nInspLimit + 0x130) != 0) {
      free(*(void **)(Params.nInspLimit + 0x130));
      *(undefined8 *)(Params.nInspLimit + 0x130) = 0;
    }
    iVar2 = Abc_NtkCiNum((Abc_Ntk_t *)Params.nInspLimit);
    pvVar3 = malloc((long)iVar2 << 2);
    *(void **)(Params.nInspLimit + 0x130) = pvVar3;
    pvVar3 = *(void **)(Params.nInspLimit + 0x130);
    iVar2 = Abc_NtkCiNum((Abc_Ntk_t *)Params.nInspLimit);
    memcpy(pvVar3,__src,(long)iVar2 << 2);
  }
  *pRetValue = iVar1;
  iVar1 = Fraig_ManReadSatFails(p);
  *pNumFails = iVar1;
  iVar1 = Fraig_ManReadConflicts(p);
  *pNumConfs = (long)iVar1;
  iVar1 = Fraig_ManReadInspects(p);
  *pNumInspects = (long)iVar1;
  Fraig_ManFree(p);
  return (Abc_Ntk_t *)Params.nInspLimit;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterFraig( Abc_Ntk_t * pNtk, int nBTLimit, ABC_INT64_T nInspLimit, int * pRetValue, int * pNumFails, ABC_INT64_T * pNumConfs, ABC_INT64_T * pNumInspects )
{
    Abc_Ntk_t * pNtkNew;
    Fraig_Params_t Params, * pParams = &Params;
    Fraig_Man_t * pMan;
    int nWords1, nWords2, nWordsMin, RetValue;
    int * pModel;

    // to determine the number of simulation patterns
    // use the following strategy
    // at least 64 words (32 words random and 32 words dynamic)
    // no more than 256M for one circuit (128M + 128M)
    nWords1 = 32;
    nWords2 = (1<<27) / (Abc_NtkNodeNum(pNtk) + Abc_NtkCiNum(pNtk));
    nWordsMin = Abc_MinInt( nWords1, nWords2 );

    // set the FRAIGing parameters
    Fraig_ParamsSetDefault( pParams );
    pParams->nPatsRand  = nWordsMin * 32; // the number of words of random simulation info
    pParams->nPatsDyna  = nWordsMin * 32; // the number of words of dynamic simulation info
    pParams->nBTLimit   = nBTLimit;       // the max number of backtracks
    pParams->nSeconds   = -1;             // the runtime limit
    pParams->fTryProve  = 0;              // do not try to prove the final miter
    pParams->fDoSparse  = 1;              // try proving sparse functions
    pParams->fVerbose   = 0;
    pParams->nInspLimit = nInspLimit;

    // transform the target into a fraig
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtk, pParams, 0, 0 ); 
    Fraig_ManProveMiter( pMan );
    RetValue = Fraig_ManCheckMiter( pMan );

    // create the network 
    pNtkNew = Abc_NtkFromFraig( pMan, pNtk );

    // save model
    if ( RetValue == 0 )
    {
        pModel = Fraig_ManReadModel( pMan );
        ABC_FREE( pNtkNew->pModel );
        pNtkNew->pModel = ABC_ALLOC( int, Abc_NtkCiNum(pNtkNew) );
        memcpy( pNtkNew->pModel, pModel, sizeof(int) * Abc_NtkCiNum(pNtkNew) );
    }

    // save the return values
    *pRetValue = RetValue;
    *pNumFails = Fraig_ManReadSatFails( pMan );
    *pNumConfs = Fraig_ManReadConflicts( pMan );
    *pNumInspects = Fraig_ManReadInspects( pMan );

    // delete the fraig manager
    Fraig_ManFree( pMan );
    return pNtkNew;
}